

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__encode_half_float_linear_ABGR(void *outputp,int width_times_channels,float *encode)

{
  undefined1 (*pauVar1) [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float *pfVar8;
  float fVar9;
  int iVar10;
  stbir__FP16 *output;
  undefined1 (*pauVar11) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar19;
  undefined1 auVar17 [16];
  float fVar20;
  undefined1 auVar18 [16];
  float fVar21;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  auVar6 = _DAT_00195460;
  pauVar1 = (undefined1 (*) [16])((long)outputp + (long)width_times_channels * 2);
  if (width_times_channels < 8) {
    if (3 < width_times_channels) {
      pauVar11 = (undefined1 (*) [16])((long)outputp + 8);
      pfVar8 = encode + 3;
      do {
        fVar9 = ABS(*pfVar8);
        if ((uint)fVar9 < 0x47800000) {
          if ((uint)fVar9 < 0x38800000) {
            fVar7 = fVar9 + 0.5;
          }
          else {
            fVar9 = (float)((int)fVar9 + 0x8000fff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
            fVar7 = fVar9;
          }
        }
        else {
          fVar7 = (float)((0x7f800000 < (uint)fVar9 | 0x3e) << 9);
        }
        iVar10 = movmskps(fVar9,ZEXT416((uint)*pfVar8));
        *(ushort *)(pauVar11[-1] + 8) = (ushort)(iVar10 << 0xf) | SUB42(fVar7,0);
        fVar9 = ABS(pfVar8[-1]);
        if ((uint)fVar9 < 0x47800000) {
          if ((uint)fVar9 < 0x38800000) {
            fVar7 = fVar9 + 0.5;
          }
          else {
            fVar9 = (float)((int)fVar9 + 0x8000fff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
            fVar7 = fVar9;
          }
        }
        else {
          fVar7 = (float)((0x7f800000 < (uint)fVar9 | 0x3e) << 9);
        }
        iVar10 = movmskps(fVar9,ZEXT416((uint)pfVar8[-1]));
        *(ushort *)(pauVar11[-1] + 10) = (ushort)(iVar10 << 0xf) | SUB42(fVar7,0);
        fVar9 = ABS(pfVar8[-2]);
        if ((uint)fVar9 < 0x47800000) {
          if ((uint)fVar9 < 0x38800000) {
            fVar7 = fVar9 + 0.5;
          }
          else {
            fVar9 = (float)((int)fVar9 + 0x8000fff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
            fVar7 = fVar9;
          }
        }
        else {
          fVar7 = (float)((0x7f800000 < (uint)fVar9 | 0x3e) << 9);
        }
        iVar10 = movmskps(fVar9,ZEXT416((uint)pfVar8[-2]));
        *(ushort *)(pauVar11[-1] + 0xc) = (ushort)(iVar10 << 0xf) | SUB42(fVar7,0);
        fVar9 = ABS(pfVar8[-3]);
        if ((uint)fVar9 < 0x47800000) {
          if ((uint)fVar9 < 0x38800000) {
            fVar7 = fVar9 + 0.5;
          }
          else {
            fVar9 = (float)((int)fVar9 + 0x8000fff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
            fVar7 = fVar9;
          }
        }
        else {
          fVar7 = (float)((0x7f800000 < (uint)fVar9 | 0x3e) << 9);
        }
        iVar10 = movmskps(fVar9,ZEXT416((uint)pfVar8[-3]));
        *(ushort *)(pauVar11[-1] + 0xe) = (ushort)(iVar10 << 0xf) | SUB42(fVar7,0);
        pauVar11 = (undefined1 (*) [16])((long)*pauVar11 + 8);
        pfVar8 = pfVar8 + 4;
      } while (pauVar11 <= pauVar1);
    }
  }
  else {
    pfVar8 = encode;
    do {
      do {
        fVar9 = *pfVar8;
        fVar7 = pfVar8[1];
        fVar19 = pfVar8[2];
        fVar20 = pfVar8[3];
        fVar2 = pfVar8[4];
        fVar3 = pfVar8[5];
        fVar4 = pfVar8[6];
        fVar5 = pfVar8[7];
        fVar21 = ABS(fVar20);
        fVar24 = ABS(fVar19);
        fVar25 = ABS(fVar7);
        fVar26 = ABS(fVar9);
        auVar15._0_4_ = -(uint)(0x387fffff < (uint)fVar21);
        auVar15._4_4_ = -(uint)(0x387fffff < (uint)fVar24);
        auVar15._8_4_ = -(uint)(0x387fffff < (uint)fVar25);
        auVar15._12_4_ = -(uint)(0x387fffff < (uint)fVar26);
        auVar27._0_4_ = (int)(fVar21 + 0.5) + -0x3f000000;
        auVar27._4_4_ = (int)(fVar24 + 0.5) + -0x3f000000;
        auVar27._8_4_ = (int)(fVar25 + 0.5) + -0x3f000000;
        auVar27._12_4_ = (int)(fVar26 + 0.5) + -0x3f000000;
        auVar17._0_4_ = (int)fVar21 + -0x37fff001 + ((uint)fVar20 >> 0xd & 1) >> 0xd;
        auVar17._4_4_ = (int)fVar24 + -0x37fff001 + ((uint)fVar19 >> 0xd & 1) >> 0xd;
        auVar17._8_4_ = (int)fVar25 + -0x37fff001 + ((uint)fVar7 >> 0xd & 1) >> 0xd;
        auVar17._12_4_ = (int)fVar26 + -0x37fff001 + ((uint)fVar9 >> 0xd & 1) >> 0xd;
        auVar22._0_4_ = -(uint)(0x477fffff < (uint)fVar21);
        auVar22._4_4_ = -(uint)(0x477fffff < (uint)fVar24);
        auVar22._8_4_ = -(uint)(0x477fffff < (uint)fVar25);
        auVar22._12_4_ = -(uint)(0x477fffff < (uint)fVar26);
        auVar28._0_4_ = (-(uint)NAN(fVar21) & 0x200 | 0x7c00) & auVar22._0_4_;
        auVar28._4_4_ = (-(uint)NAN(fVar24) & 0x200 | 0x7c00) & auVar22._4_4_;
        auVar28._8_4_ = (-(uint)NAN(fVar25) & 0x200 | 0x7c00) & auVar22._8_4_;
        auVar28._12_4_ = (-(uint)NAN(fVar26) & 0x200 | 0x7c00) & auVar22._12_4_;
        auVar14._0_4_ = (int)fVar20 >> 0x10;
        auVar14._4_4_ = (int)fVar19 >> 0x10;
        auVar14._8_4_ = (int)fVar7 >> 0x10;
        auVar14._12_4_ = (int)fVar9 >> 0x10;
        fVar9 = ABS(fVar5);
        fVar7 = ABS(fVar4);
        fVar19 = ABS(fVar3);
        fVar20 = ABS(fVar2);
        auVar23._0_4_ = -(uint)(0x387fffff < (uint)fVar9);
        auVar23._4_4_ = -(uint)(0x387fffff < (uint)fVar7);
        auVar23._8_4_ = -(uint)(0x387fffff < (uint)fVar19);
        auVar23._12_4_ = -(uint)(0x387fffff < (uint)fVar20);
        auVar12._0_4_ = (int)(fVar9 + 0.5) + -0x3f000000;
        auVar12._4_4_ = (int)(fVar7 + 0.5) + -0x3f000000;
        auVar12._8_4_ = (int)(fVar19 + 0.5) + -0x3f000000;
        auVar12._12_4_ = (int)(fVar20 + 0.5) + -0x3f000000;
        auVar29._0_4_ = (int)fVar9 + -0x37fff001 + ((uint)fVar5 >> 0xd & 1) >> 0xd;
        auVar29._4_4_ = (int)fVar7 + -0x37fff001 + ((uint)fVar4 >> 0xd & 1) >> 0xd;
        auVar29._8_4_ = (int)fVar19 + -0x37fff001 + ((uint)fVar3 >> 0xd & 1) >> 0xd;
        auVar29._12_4_ = (int)fVar20 + -0x37fff001 + ((uint)fVar2 >> 0xd & 1) >> 0xd;
        auVar18._0_4_ = -(uint)(0x477fffff < (uint)fVar9);
        auVar18._4_4_ = -(uint)(0x477fffff < (uint)fVar7);
        auVar18._8_4_ = -(uint)(0x477fffff < (uint)fVar19);
        auVar18._12_4_ = -(uint)(0x477fffff < (uint)fVar20);
        auVar13._0_4_ = (-(uint)NAN(fVar9) & 0x200 | 0x7c00) & auVar18._0_4_;
        auVar13._4_4_ = (-(uint)NAN(fVar7) & 0x200 | 0x7c00) & auVar18._4_4_;
        auVar13._8_4_ = (-(uint)NAN(fVar19) & 0x200 | 0x7c00) & auVar18._8_4_;
        auVar13._12_4_ = (-(uint)NAN(fVar20) & 0x200 | 0x7c00) & auVar18._12_4_;
        auVar16._0_4_ = (int)fVar5 >> 0x10;
        auVar16._4_4_ = (int)fVar4 >> 0x10;
        auVar16._8_4_ = (int)fVar3 >> 0x10;
        auVar16._12_4_ = (int)fVar2 >> 0x10;
        auVar15 = packssdw(auVar14 & auVar6 | auVar28 |
                           ~auVar22 & (~auVar15 & auVar27 | auVar17 & auVar15),
                           auVar16 & auVar6 | auVar13 |
                           ~auVar18 & (~auVar23 & auVar12 | auVar29 & auVar23));
        *(undefined1 (*) [16])outputp = auVar15;
        pauVar11 = (undefined1 (*) [16])((long)outputp + 0x10);
        pfVar8 = pfVar8 + 8;
        outputp = pauVar11;
      } while (pauVar11 <= pauVar1 + -1);
      pfVar8 = encode + (long)width_times_channels + -8;
      outputp = pauVar1 + -1;
    } while (pauVar11 != pauVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_half_float_linear )( void * outputp, int width_times_channels, float const * encode )
{
  stbir__FP16 STBIR_SIMD_STREAMOUT_PTR( * ) output = (stbir__FP16*) outputp;
  stbir__FP16 * end_output = ( (stbir__FP16*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    float const * end_encode_m8 = encode + width_times_channels - 8;
    end_output -= 8;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_SIMD_NO_UNROLL(encode);
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, encode );
        stbir__encode_simdf8_unflip( of );
        stbir__float_to_half_SIMD( output, (float*)&of );
      }
      #else
      {
        stbir__simdf of[2];
        stbir__simdf_load( of[0], encode );
        stbir__simdf_load( of[1], encode+4 );
        stbir__encode_simdf4_unflip( of[0] );
        stbir__encode_simdf4_unflip( of[1] );
        stbir__float_to_half_SIMD( output, (float*)of );
      }
      #endif
      #else
      stbir__float_to_half_SIMD( output, encode );
      #endif
      encode += 8;
      output += 8;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 8 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(output);
    output[0-4] = stbir__float_to_half(encode[stbir__encode_order0]);
    output[1-4] = stbir__float_to_half(encode[stbir__encode_order1]);
    output[2-4] = stbir__float_to_half(encode[stbir__encode_order2]);
    output[3-4] = stbir__float_to_half(encode[stbir__encode_order3]);
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(output);
    output[0] = stbir__float_to_half(encode[stbir__encode_order0]);
    #if stbir__coder_min_num >= 2
    output[1] = stbir__float_to_half(encode[stbir__encode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__float_to_half(encode[stbir__encode_order2]);
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}